

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O2

vector<duckdb::OpenFileInfo,_true> * __thiscall
duckdb::GlobMultiFileList::GetAllFiles
          (vector<duckdb::OpenFileInfo,_true> *__return_storage_ptr__,GlobMultiFileList *this)

{
  bool bVar1;
  
  ::std::mutex::lock(&this->lock);
  do {
    bVar1 = ExpandNextPath(this);
  } while (bVar1);
  ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::vector
            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
             __return_storage_ptr__,
             (vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
             &this->expanded_files);
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return __return_storage_ptr__;
}

Assistant:

vector<OpenFileInfo> GlobMultiFileList::GetAllFiles() {
	lock_guard<mutex> lck(lock);
	while (ExpandNextPath()) {
	}
	return expanded_files;
}